

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O2

void __thiscall NaPNDelay::print_status(NaPNDelay *this)

{
  NaPetriCnInput *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  NaPetriNet *this_01;
  char *pcVar5;
  char *pcVar6;
  NaVector *pNVar7;
  NaReal *pNVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  this_01 = NaPetriNode::net(&this->super_NaPetriNode);
  pcVar5 = NaPetriNet::name(this_01);
  pcVar6 = NaPetriNode::name(&this->super_NaPetriNode);
  NaPrintLog("NaPNDelay (%p, %s.%s):",this,pcVar5,pcVar6);
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n",(ulong)this->nMaxLag,(ulong)this->nMinLag);
  NaPrintLog("  nActiveSleep=%u\n",(ulong)this->nActiveSleep);
  pcVar5 = "false";
  if (this->bAwaken != false) {
    pcVar5 = "true";
  }
  NaPrintLog("  bAwaken=%s\n",pcVar5);
  if (this->bSleepValue == false) {
    pcVar5 = "  bSleepValue=false\n";
  }
  else {
    if (this->bSleepValue1st != true) {
      NaPrintLog("  bSleepValue=true,  fSleepValue=%g\n",this->fSleepValue);
      goto LAB_0013e6db;
    }
    pcVar5 = "  bSleepValue=true,  fSleepValue=(First)\n";
  }
  NaPrintLog(pcVar5);
LAB_0013e6db:
  NaPrintLog("  delays map:");
  for (lVar12 = 0; lVar12 < this->nOutDim; lVar12 = lVar12 + 1) {
    NaPrintLog(" %u",(ulong)this->piOutMap[lVar12]);
  }
  NaPrintLog("\n");
  bVar1 = NaPetriNode::tunable(&this->super_NaPetriNode);
  if (!bVar1) {
    NaPrintLog("  delayed values in buffer:\n");
    this_00 = &this->in;
    uVar11 = 0;
    while( true ) {
      uVar2 = NaVector::dim(&this->vBuffer);
      pNVar7 = NaPetriCnInput::data(this_00);
      uVar3 = (*pNVar7->_vptr_NaVector[6])(pNVar7);
      if (uVar2 / uVar3 <= uVar11) break;
      uVar9 = (ulong)(uint)this->nOutDim;
      if (this->nOutDim < 1) {
        uVar9 = 0;
      }
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        if (this->piOutMap[uVar10] == uVar11) {
          NaPrintLog("  [%d] ->",(ulong)this->piOutMap[uVar10]);
          goto LAB_0013e7d6;
        }
      }
      NaPrintLog("      ->");
LAB_0013e7d6:
      uVar2 = 0;
      while( true ) {
        pNVar7 = NaPetriCnInput::data(this_00);
        uVar3 = (*pNVar7->_vptr_NaVector[6])(pNVar7);
        if (uVar3 <= uVar2) break;
        pNVar7 = NaPetriCnInput::data(this_00);
        iVar4 = (*pNVar7->_vptr_NaVector[6])(pNVar7);
        pNVar8 = NaVector::operator[](&this->vBuffer,iVar4 * uVar11 + uVar2);
        NaPrintLog(" %g",*pNVar8);
        uVar2 = uVar2 + 1;
      }
      NaPrintLog("\n");
      uVar11 = uVar11 + 1;
    }
  }
  return;
}

Assistant:

void
NaPNDelay::print_status ()
{
  int	i, j;

  /* Print delay information anyway */
  NaPrintLog("NaPNDelay (%p, %s.%s):", this, net()->name(), name());
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n", nMaxLag, nMinLag);
  NaPrintLog("  nActiveSleep=%u\n", nActiveSleep);
  NaPrintLog("  bAwaken=%s\n", bAwaken?"true":"false");
  if(!bSleepValue)
      NaPrintLog("  bSleepValue=false\n");
  else if(bSleepValue1st)
      NaPrintLog("  bSleepValue=true,  fSleepValue=(First)\n");
  else
      NaPrintLog("  bSleepValue=true,  fSleepValue=%g\n", fSleepValue);
  NaPrintLog("  delays map:");
  for(i = 0; i < nOutDim; ++i)
    NaPrintLog(" %u", piOutMap[i]);
  NaPrintLog("\n");

  if(!tunable()){
    /* Additional runtime info */
    NaPrintLog("  delayed values in buffer:\n");
    for(j = 0; j < vBuffer.dim() / in.data().dim(); ++j){
      for(i = 0; i < nOutDim; ++i)
	if(piOutMap[i] == j)
	  break;
      if(i < nOutDim)
	NaPrintLog("  [%d] ->", piOutMap[i]);
      else
	NaPrintLog("      ->");

      for(i = 0; i < in.data().dim(); ++i)
	NaPrintLog(" %g", vBuffer[j * in.data().dim() + i]);
      NaPrintLog("\n");
    }
  }
}